

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty_printer.hpp
# Opt level: O0

void __thiscall
trial::protocol::json::example::pretty_printer::print_array_element(pretty_printer *this,int count)

{
  basic_writer<char,_16UL> *pbVar1;
  value vVar2;
  error *this_00;
  size_type sVar3;
  error_code eVar4;
  basic_string_view<char,_std::char_traits<char>_> local_68 [2];
  uint local_48;
  error_category *local_40;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  int local_14;
  pretty_printer *ppStack_10;
  int count_local;
  pretty_printer *this_local;
  
  local_14 = count;
  ppStack_10 = this;
  vVar2 = symbol(this);
  switch(vVar2) {
  case begin_array:
    if (0 < local_14) {
      pbVar1 = this->writer;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,",");
      basic_writer<char,_16UL>::literal(pbVar1,&local_28);
      newline(this);
    }
    print_array(this,true);
    break;
  case end_array:
    break;
  case begin_object:
    if (0 < local_14) {
      pbVar1 = this->writer;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,",");
      basic_writer<char,_16UL>::literal(pbVar1,&local_38);
      newline(this);
    }
    print_object(this,true);
    break;
  case end_object:
    this_00 = (error *)__cxa_allocate_exception(0x20);
    eVar4 = make_error_code(unbalanced_end_object);
    local_48 = eVar4._M_value;
    eVar4._4_4_ = 0;
    eVar4._M_value = local_48;
    local_40 = eVar4._M_cat;
    error::error(this_00,eVar4);
    __cxa_throw(this_00,&error::typeinfo,error::~error);
  default:
    if (0 < local_14) {
      pbVar1 = this->writer;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_68,",");
      basic_writer<char,_16UL>::literal(pbVar1,local_68);
      newline(this);
    }
    sVar3 = basic_reader<char>::level(this->reader);
    indent(this,(int)sVar3);
    print_value(this);
  }
  return;
}

Assistant:

void print_array_element(int count)
    {
        switch (symbol())
        {
        case json::token::symbol::begin_array:
            if (count > 0)
            {
                writer.literal(",");
                newline();
            }
            print_array(true);
            break;

        case json::token::symbol::end_array:
            break;

        case json::token::symbol::begin_object:
            if (count > 0)
            {
                writer.literal(",");
                newline();
            }
            print_object(true);
            break;

        case json::token::symbol::end_object:
            throw json::error(make_error_code(json::unbalanced_end_object));

        default:
            if (count > 0)
            {
                writer.literal(",");
                newline();
            }
            indent(reader.level());
            print_value();
            break;
        }
    }